

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::Deallocate<8ul,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>
               (Alloc<phmap::priv::hash_internal::EnumClass> *alloc,void *p,size_t n)

{
  Alloc<M> local_28;
  A mem_alloc;
  size_t n_local;
  void *p_local;
  Alloc<phmap::priv::hash_internal::EnumClass> *alloc_local;
  
  mem_alloc.id_ = n;
  if (n == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0x106f,
                  "void phmap::priv::Deallocate(Alloc *, void *, size_t) [Alignment = 8UL, Alloc = phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>]"
                 );
  }
  Alloc<M>::Alloc<phmap::priv::hash_internal::EnumClass>(&local_28,alloc);
  allocator_traits<phmap::priv::Alloc<M>_>::deallocate(&local_28,(pointer)p,mem_alloc.id_ + 7 >> 3);
  Alloc<M>::~Alloc(&local_28);
  return;
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  AT::deallocate(mem_alloc, static_cast<M*>(p),
                 (n + sizeof(M) - 1) / sizeof(M));
}